

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

bool __thiscall
ctemplate::SectionTemplateNode::AddVariableNode
          (SectionTemplateNode *this,TemplateToken *token,Template *my_template)

{
  TemplateContext TVar1;
  HtmlParser *htmlparser;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  VariableTemplateNode *this_00;
  char *pcVar6;
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  modvals;
  string error_msg;
  _Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  local_68;
  string variable_name;
  
  if (token == (TemplateToken *)0x0) {
    __assert_fail("token",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                  ,0x62e,
                  "bool ctemplate::SectionTemplateNode::AddVariableNode(TemplateToken *, Template *)"
                 );
  }
  TVar1 = my_template->initial_context_;
  bVar2 = true;
  if (TVar1 == TC_MANUAL) goto LAB_00120bb8;
  htmlparser = my_template->htmlparser_;
  variable_name._M_dataplus._M_p = (pointer)&variable_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&variable_name,token->text,token->text + token->textlen);
  bVar2 = std::operator==(&variable_name,"BI_SPACE");
  if (bVar2) {
LAB_001209a1:
    bVar2 = true;
    if (TVar1 - TC_HTML < 3) {
      if (htmlparser == (HtmlParser *)0x0) {
        __assert_fail("htmlparser",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                      ,0x63e,
                      "bool ctemplate::SectionTemplateNode::AddVariableNode(TemplateToken *, Template *)"
                     );
      }
      iVar4 = ctemplate_htmlparser::HtmlParser::state(htmlparser);
      if (iVar4 != 7) {
        bVar3 = std::operator==(&variable_name,"BI_SPACE");
        pcVar6 = "\n";
        if (bVar3) {
          pcVar6 = " ";
        }
        std::__cxx11::string::string((string *)&error_msg,pcVar6,(allocator *)&local_68);
        iVar4 = ctemplate_htmlparser::HtmlParser::Parse(htmlparser,&error_msg);
        std::__cxx11::string::~string((string *)&error_msg);
        if (iVar4 != 7) goto LAB_00120bae;
      }
      bVar2 = false;
    }
  }
  else {
    bVar2 = std::operator==(&variable_name,"BI_NEWLINE");
    if (bVar2) goto LAB_001209a1;
    error_msg._M_dataplus = variable_name._M_dataplus;
    bVar3 = std::binary_search<char_const*const*,char_const*,ctemplate::StringHash>
                      (&Template::kSafeWhitelistedVariables,&vtable);
    bVar2 = true;
    if (!bVar3) {
      modvals.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      error_msg._M_dataplus._M_p = (pointer)&error_msg.field_2;
      error_msg._M_string_length = 0;
      modvals.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      modvals.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      error_msg.field_2._M_local_buf[0] = '\0';
      if (TVar1 == TC_CSS) {
        if (htmlparser == (HtmlParser *)0x0) {
          __assert_fail("htmlparser",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                        ,0x216,
                        "const vector<const ModifierAndValue *> ctemplate::(anonymous namespace)::GetModifierForContext(TemplateContext, HtmlParser *, const Template *)"
                       );
        }
        GetModifierForCss((vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                           *)&local_68,htmlparser,&error_msg);
      }
      else if (TVar1 == TC_JSON) {
        GetModifierForJson((vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                            *)&local_68,htmlparser,&error_msg);
      }
      else if (TVar1 == TC_XML) {
        GetModifierForXml((vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                           *)&local_68,htmlparser,&error_msg);
      }
      else {
        if (2 < TVar1 - TC_HTML) {
          __assert_fail("AUTO_ESCAPE_PARSING_CONTEXT(my_context)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                        ,0x21b,
                        "const vector<const ModifierAndValue *> ctemplate::(anonymous namespace)::GetModifierForContext(TemplateContext, HtmlParser *, const Template *)"
                       );
        }
        if (htmlparser == (HtmlParser *)0x0) {
          __assert_fail("htmlparser",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                        ,0x21c,
                        "const vector<const ModifierAndValue *> ctemplate::(anonymous namespace)::GetModifierForContext(TemplateContext, HtmlParser *, const Template *)"
                       );
        }
        GetModifierForHtmlJs
                  ((vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                    *)&local_68,htmlparser,&error_msg);
      }
      std::
      vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ::_M_move_assign(&modvals,&local_68);
      std::
      _Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ::~_Vector_base(&local_68);
      if (modvals.
          super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          modvals.
          super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
        poVar5 = std::operator<<(poVar5,"Template ");
        poVar5 = std::operator<<(poVar5,(my_template->resolved_filename_)._M_dataplus._M_p);
        std::operator<<(poVar5,": ");
        poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
        poVar5 = std::operator<<(poVar5,"Auto-Escape: ");
        poVar5 = std::operator<<(poVar5,(string *)&error_msg);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      std::__cxx11::string::~string((string *)&error_msg);
      bVar2 = modvals.
              super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              modvals.
              super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar2) {
        TemplateToken::UpdateModifier(token,&modvals);
      }
      std::
      _Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ::~_Vector_base(&modvals.
                       super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                     );
    }
  }
LAB_00120bae:
  std::__cxx11::string::~string((string *)&variable_name);
LAB_00120bb8:
  this_00 = (VariableTemplateNode *)operator_new(0x58);
  VariableTemplateNode::VariableTemplateNode(this_00,token);
  error_msg._M_dataplus._M_p = (pointer)this_00;
  std::__cxx11::list<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>::
  push_back(&this->node_list_,(value_type *)&error_msg);
  return bVar2;
}

Assistant:

bool SectionTemplateNode::AddVariableNode(TemplateToken* token,
                                          Template* my_template) {
  assert(token);
  bool success = true;
  HtmlParser *htmlparser = my_template->htmlparser_;
  TemplateContext initial_context = my_template->initial_context_;

  if (AUTO_ESCAPE_MODE(initial_context)) {
    // Determines modifiers for the variable in auto escape mode.
    string variable_name(token->text, token->textlen);
    // We declare in the documentation that if the user changes the
    // value of these variables, they must only change it to a value
    // that's "equivalent" from the point of view of an html parser.
    // So it's ok to hard-code in that these are " " and "\n",
    // respectively, even though in theory the user could change them
    // (to say, BI_NEWLINE == "\r\n").
    if (variable_name == "BI_SPACE" || variable_name == "BI_NEWLINE") {
      if (AUTO_ESCAPE_PARSING_CONTEXT(initial_context)) {
        assert(htmlparser);
        if (htmlparser->state() == HtmlParser::STATE_ERROR ||
            htmlparser->Parse(variable_name == "BI_SPACE" ? " " : "\n") ==
            HtmlParser::STATE_ERROR)
          success = false;
      }
    } else if (binary_search(Template::kSafeWhitelistedVariables,
                             Template::kSafeWhitelistedVariables +
                             arraysize(Template::kSafeWhitelistedVariables),
                             variable_name.c_str(),
                             // Luckily, StringHash(a, b) is defined as "a < b"
                             StringHash())) {
      // Do not escape the variable, it is whitelisted.
    } else {
      vector<const ModifierAndValue*> modvals =
          GetModifierForContext(initial_context, htmlparser, my_template);
      // There should always be at least one modifier in any Auto-Escape mode.
      if (modvals.empty())
        success = false;
      else
        token->UpdateModifier(modvals);
    }
  }
  node_list_.push_back(new VariableTemplateNode(*token));
  return success;
}